

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::ScaleParameter::InternalSerializeWithCachedSizesToArray
          (ScaleParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool value;
  int32 iVar2;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  ScaleParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 8) != 0) {
    iVar2 = axis(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,iVar2,target);
  }
  if ((uVar1 & 0x10) != 0) {
    iVar2 = num_axes(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,iVar2,puStack_40);
  }
  if ((uVar1 & 1) != 0) {
    puStack_40 = google::protobuf::internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                           (3,this->filler_,deterministic,puStack_40);
  }
  if ((uVar1 & 4) != 0) {
    value = bias_term(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(4,value,puStack_40);
  }
  if ((uVar1 & 2) != 0) {
    puStack_40 = google::protobuf::internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                           (5,this->bias_filler_,deterministic,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ScaleParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* ScaleParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ScaleParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 axis = 1 [default = 1];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->axis(), target);
  }

  // optional int32 num_axes = 2 [default = 1];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->num_axes(), target);
  }

  // optional .caffe.FillerParameter filler = 3;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->filler_, deterministic, target);
  }

  // optional bool bias_term = 4 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(4, this->bias_term(), target);
  }

  // optional .caffe.FillerParameter bias_filler = 5;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, *this->bias_filler_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ScaleParameter)
  return target;
}